

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O2

Iterator __thiscall ODDLParser::Value::Iterator::operator++(Iterator *this,int param_2)

{
  Value *pVVar1;
  undefined4 in_register_00000014;
  Iterator *inst;
  Value *in_RDI;
  ValueType VVar2;
  undefined4 uVar3;
  ValueType VVar4;
  undefined4 uVar5;
  Iterator IVar6;
  
  IVar6.m_current._4_4_ = in_register_00000014;
  IVar6.m_current._0_4_ = param_2;
  pVVar1 = this->m_current;
  VVar2 = ODDLParser::end._0_4_;
  uVar3 = ODDLParser::end._4_4_;
  VVar4 = ODDLParser::end._8_4_;
  uVar5 = ODDLParser::end._12_4_;
  if (pVVar1 != (Value *)0x0) {
    VVar2 = *(ValueType *)&pVVar1->m_next;
    uVar3 = *(undefined4 *)((long)&pVVar1->m_next + 4);
    *(ValueType *)&this->m_current = VVar2;
    *(undefined4 *)((long)&this->m_current + 4) = uVar3;
    VVar4 = VVar2;
    uVar5 = uVar3;
  }
  in_RDI->m_type = VVar2;
  *(undefined4 *)&in_RDI->field_0x4 = uVar3;
  *(ValueType *)&in_RDI->m_size = VVar4;
  *(undefined4 *)((long)&in_RDI->m_size + 4) = uVar5;
  IVar6.m_start = in_RDI;
  return IVar6;
}

Assistant:

const Value::Iterator Value::Iterator::operator++( int ) {
    if( ddl_nullptr == m_current ) {
        return end;
    }

    m_current = m_current->getNext();
    Iterator inst( m_current );

    return inst;
}